

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dblp_std.cpp
# Opt level: O2

void * parseAttribute(SymbolContext<char> *ctx)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__x;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__y;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this;
  
  __x = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*ctx->values;
  __y = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ctx->values[1];
  this = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)operator_new(0x40);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (this,__x,__y);
  std::__cxx11::string::~string((string *)__x);
  operator_delete(__x);
  std::__cxx11::string::~string((string *)__y);
  operator_delete(__y);
  return this;
}

Assistant:

XMLElement& operator=(XMLElement&& old)
    {
        m_name = std::move(old.m_name);
        m_attributes = std::move(old.m_attributes);
        m_body = std::move(old.m_body);
        return *this;
    }